

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guest-random.c
# Opt level: O1

int glib_random_bytes(void *buf,size_t len)

{
  long *plVar1;
  void *pvVar2;
  GRand *rand;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  guint32 local_2c;
  
  plVar1 = (long *)__tls_get_addr(&PTR_01103bb8);
  rand = (GRand *)*plVar1;
  if (rand == (GRand *)0x0) {
    rand = g_rand_new();
    *plVar1 = (long)rand;
  }
  if (len < 4) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    do {
      local_2c = g_rand_int(rand);
      *(guint32 *)((long)buf + uVar4) = local_2c;
      uVar5 = uVar4 + 4;
      uVar3 = uVar4 + 8;
      uVar4 = uVar5;
    } while (uVar3 <= len);
  }
  if (uVar5 < len) {
    local_2c = g_rand_int(rand);
    pvVar2 = memcpy((void *)((long)buf + uVar5),&local_2c,uVar5 - len);
    local_2c = (guint32)pvVar2;
  }
  return local_2c;
}

Assistant:

static int glib_random_bytes(void *buf, size_t len)
{
#ifndef _MSC_VER
    GRand *rand = thread_rand;
    size_t i;
    uint32_t x;

    if (unlikely(rand == NULL)) {
        /* Thread not initialized for a cpu, or main w/o -seed.  */
        thread_rand = rand = g_rand_new();
    }

    for (i = 0; i + 4 <= len; i += 4) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, 4);
    }
    if (i < len) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, i - len);
    }
#endif
    return 0;
}